

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O1

void __thiscall ki::protocol::dml::Message::read_from(Message *this,istream *istream)

{
  MessageHeader *this_00;
  uint8_t uVar1;
  uint8_t uVar2;
  uint16_t uVar3;
  value_error *pvVar4;
  parse_error *this_01;
  string local_80;
  string local_60;
  string local_40;
  
  this_00 = &this->m_header;
  MessageHeader::read_from(this_00,istream);
  if (this->m_template == (MessageTemplate *)0x0) {
    uVar3 = MessageHeader::get_message_size(this_00);
    std::vector<char,_std::allocator<char>_>::resize(&this->m_raw_data,(ulong)uVar3);
    std::istream::read((char *)istream,
                       (long)(this->m_raw_data).super__Vector_base<char,_std::allocator<char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    if (((byte)istream[*(long *)(*(long *)istream + -0x18) + 0x20] & 5) == 0) {
      return;
    }
    this_01 = (parse_error *)__cxa_allocate_exception(0x18);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"Not enough data was available to read DML message payload.","");
    parse_error::parse_error(this_01,&local_80,INSUFFICIENT_MESSAGE_DATA);
    __cxa_throw(this_01,&parse_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar1 = MessageHeader::get_service_id(this_00);
  uVar2 = MessageTemplate::get_service_id(this->m_template);
  if (uVar1 == uVar2) {
    uVar1 = MessageHeader::get_type(this_00);
    uVar2 = MessageTemplate::get_type(this->m_template);
    if (uVar1 == uVar2) {
      ki::dml::Record::read_from(this->m_record,istream);
      return;
    }
    pvVar4 = (value_error *)__cxa_allocate_exception(0x18);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,
               "Message Type mismatch between MessageHeader and assigned template.","");
    value_error::value_error(pvVar4,&local_60,DML_INVALID_MESSAGE_TYPE);
    __cxa_throw(pvVar4,&value_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar4 = (value_error *)__cxa_allocate_exception(0x18);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"ServiceID mismatch between MessageHeader and assigned template.",
             "");
  value_error::value_error(pvVar4,&local_40,DML_INVALID_SERVICE);
  __cxa_throw(pvVar4,&value_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Message::read_from(std::istream &istream)
	{
		m_header.read_from(istream);
		if (m_template)
		{
			// Check for mismatches between the header and template
			if (m_header.get_service_id() != m_template->get_service_id())
				throw value_error("ServiceID mismatch between MessageHeader and assigned template.",
					value_error::DML_INVALID_SERVICE);
			if (m_header.get_type() != m_template->get_type())
				throw value_error("Message Type mismatch between MessageHeader and assigned template.",
					value_error::DML_INVALID_MESSAGE_TYPE);
			
			// Read the payload into the record
			m_record->read_from(istream);
		}
		else
		{
			// We don't have a template for the record structure, so
			// just read the raw data into a buffer.
			const auto size = m_header.get_message_size();
			m_raw_data.resize(size);
			istream.read(m_raw_data.data(), size);
			if (istream.fail())
				throw parse_error("Not enough data was available to read DML message payload.",
					parse_error::INSUFFICIENT_MESSAGE_DATA);
		}
	}